

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O2

void docs::run(Options *options,thread_pool *pool,Program *prog)

{
  pointer pLVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pLVar5;
  pointer pDVar6;
  allocator local_c9;
  string templ;
  vector<docs::Doc,_std::allocator<docs::Doc>_> docs;
  string local_78;
  mutex docs_mutex;
  
  docs_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  docs_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  docs_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  docs_mutex.super___mutex_base._M_mutex.__align = 0;
  docs_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pLVar1 = (prog->lex_data).super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar5 = (prog->lex_data).super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar5 != pLVar1; pLVar5 = pLVar5 + 1) {
    templ.field_2._M_allocated_capacity = 0;
    templ.field_2._8_8_ = 0;
    templ._M_dataplus._M_p = (pointer)0x0;
    templ._M_string_length = 0;
    templ._M_dataplus._M_p = (pointer)operator_new(0x18);
    *(pointer *)templ._M_dataplus._M_p = pLVar5;
    *(mutex **)(templ._M_dataplus._M_p + 8) = &docs_mutex;
    *(vector<docs::Doc,_std::allocator<docs::Doc>_> **)(templ._M_dataplus._M_p + 0x10) = &docs;
    templ.field_2._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/docs.cpp:240:7)>
         ::_M_invoke;
    templ.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/docs.cpp:240:7)>
         ::_M_manager;
    thread_pool::execute(pool,(function<void_()> *)&templ);
    std::_Function_base::~_Function_base((_Function_base *)&templ);
  }
  thread_pool::wait_all(pool);
  pDVar3 = docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar4 = docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
                super__Vector_impl_data._M_start; pDVar4 != pDVar3; pDVar4 = pDVar4 + 1) {
    pDVar2 = (pDVar4->sections).
             super__Vector_base<docs::DocSection,_std::allocator<docs::DocSection>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pDVar6 = (pDVar4->sections).
                  super__Vector_base<docs::DocSection,_std::allocator<docs::DocSection>_>._M_impl.
                  super__Vector_impl_data._M_start; pDVar6 != pDVar2; pDVar6 = pDVar6 + 1) {
      std::__cxx11::string::string((string *)&templ,(string *)&options->print);
      std::__cxx11::string::string((string *)&local_78,"{id}",&local_c9);
      replace_string(&templ,&local_78,&pDVar6->id);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)&local_78,"{type}",&local_c9);
      replace_string(&templ,&local_78,&pDVar6->type);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)&local_78,"{line}",&local_c9);
      replace_string(&templ,&local_78,&pDVar6->line);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)&local_78,"{desc}",&local_c9);
      replace_string(&templ,&local_78,&pDVar6->desc);
      std::__cxx11::string::~string((string *)&local_78);
      if (templ._M_string_length != 0) {
        puts(templ._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&templ);
    }
  }
  std::vector<docs::Doc,_std::allocator<docs::Doc>_>::~vector(&docs);
  return;
}

Assistant:

void run(
  const Options& options,
  thread_pool& pool,
  const Program& prog)
{
  std::mutex docs_mutex;
  std::vector<Doc> docs;

  for (const auto& data : prog.lex_data) {
    pool.execute(
      [&data, &docs_mutex, &docs]() {
        Doc doc = process_file(data);
        {
          std::unique_lock<std::mutex> l(docs_mutex);
          docs.emplace_back(std::move(doc));
        }
      });
  }

  pool.wait_all();

  // Generate markdown file

  for (const Doc& doc : docs) {
    for (const DocSection& sec : doc.sections) {
      std::string templ = options.print;
      replace_string(templ, "{id}", sec.id);
      replace_string(templ, "{type}", sec.type);
      replace_string(templ, "{line}", sec.line);
      replace_string(templ, "{desc}", sec.desc);
      if (!templ.empty())
        std::puts(templ.c_str());
    }
  }
}